

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

void rngClose(void)

{
  mtMtxLock((mt_mtx_t *)0x12954d);
  _ctr = _ctr - 1;
  if (_ctr == 0) {
    blobClose((blob_t)0x129571);
    _state = (rng_state_st *)0x0;
  }
  mtMtxUnlock((mt_mtx_t *)0x129588);
  return;
}

Assistant:

void rngClose()
{
	ASSERT(_inited);
	mtMtxLock(_mtx);
	ASSERT(rngIsValid_internal());
	if (--_ctr == 0)
		blobClose(_state), _state = 0;
	mtMtxUnlock(_mtx);
}